

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_destroy_read_struct
               (png_structpp png_ptr_ptr,png_infopp info_ptr_ptr,png_infopp end_info_ptr_ptr)

{
  undefined8 local_28;
  png_structrp png_ptr;
  png_infopp end_info_ptr_ptr_local;
  png_infopp info_ptr_ptr_local;
  png_structpp png_ptr_ptr_local;
  
  local_28 = (png_const_structrp)0x0;
  if (png_ptr_ptr != (png_structpp)0x0) {
    local_28 = *png_ptr_ptr;
  }
  if (local_28 != (png_const_structrp)0x0) {
    png_destroy_info_struct(local_28,end_info_ptr_ptr);
    png_destroy_info_struct(local_28,info_ptr_ptr);
    *png_ptr_ptr = (png_struct *)0x0;
    png_read_destroy(local_28);
    png_destroy_png_struct(local_28);
  }
  return;
}

Assistant:

void PNGAPI
png_destroy_read_struct(png_structpp png_ptr_ptr, png_infopp info_ptr_ptr,
    png_infopp end_info_ptr_ptr)
{
   png_structrp png_ptr = NULL;

   png_debug(1, "in png_destroy_read_struct");

   if (png_ptr_ptr != NULL)
      png_ptr = *png_ptr_ptr;

   if (png_ptr == NULL)
      return;

   /* libpng 1.6.0: use the API to destroy info structs to ensure consistent
    * behavior.  Prior to 1.6.0 libpng did extra 'info' destruction in this API.
    * The extra was, apparently, unnecessary yet this hides memory leak bugs.
    */
   png_destroy_info_struct(png_ptr, end_info_ptr_ptr);
   png_destroy_info_struct(png_ptr, info_ptr_ptr);

   *png_ptr_ptr = NULL;
   png_read_destroy(png_ptr);
   png_destroy_png_struct(png_ptr);
}